

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.c
# Opt level: O0

void zxscreen_convert(void *vscr,uint *poutput,zxbox_t *dirty)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *in_RDX;
  uint *puVar6;
  long in_RSI;
  long in_RDI;
  int height;
  zxbox_t box;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint *local_50;
  uint local_44;
  int local_40;
  int y;
  uint tmp;
  uint *pal;
  uint attrs;
  uint input;
  uint *pinput;
  int linear_y;
  int x;
  int width;
  uint *pattrs;
  
  if (*in_RDX < 1) {
    local_6c = 0;
  }
  else {
    local_6c = *in_RDX;
  }
  if (local_6c < 0xff) {
    if (*in_RDX < 1) {
      local_70 = 0;
    }
    else {
      local_70 = *in_RDX;
    }
    local_74 = local_70;
  }
  else {
    local_74 = 0xff;
  }
  if (in_RDX[1] < 1) {
    local_78 = 0;
  }
  else {
    local_78 = in_RDX[1];
  }
  if (local_78 < 0xbf) {
    if (in_RDX[1] < 1) {
      local_7c = 0;
    }
    else {
      local_7c = in_RDX[1];
    }
    local_80 = local_7c;
  }
  else {
    local_80 = 0xbf;
  }
  if (in_RDX[2] < 2) {
    local_84 = 1;
  }
  else {
    local_84 = in_RDX[2];
  }
  if (local_84 < 0x100) {
    if (in_RDX[2] < 2) {
      local_88 = 1;
    }
    else {
      local_88 = in_RDX[2];
    }
    local_8c = local_88;
  }
  else {
    local_8c = 0x100;
  }
  if (in_RDX[3] < 2) {
    local_90 = 1;
  }
  else {
    local_90 = in_RDX[3];
  }
  if (local_90 < 0xc0) {
    if (in_RDX[3] < 2) {
      local_94 = 1;
    }
    else {
      local_94 = in_RDX[3];
    }
    local_98 = local_94;
  }
  else {
    local_98 = 0xc0;
  }
  local_74 = local_74 / 0x20;
  local_44 = 0xc0 - local_98;
  iVar3 = local_44 + (local_98 - local_80);
  _y = (uint *)(in_RDI + (long)((((int)local_44 / 8) * 0x20 + 0x1800 + local_74 * 4) / 4) * 4);
  _x = (uint *)(in_RSI + (long)(int)(local_44 * 0x100 + local_74 * 0x20) * 4);
  iVar4 = (local_8c + 0x1f) / 0x20 - local_74;
  for (; (int)local_44 < iVar3; local_44 = local_44 + 1) {
    uVar5 = (local_44 ^ (int)local_44 >> 3) & 7;
    local_50 = (uint *)(in_RDI + (long)((int)((local_44 ^ (uVar5 | uVar5 << 3)) * 0x20 +
                                             (local_74 << 5) / 8) / 4) * 4);
    for (local_40 = iVar4; 0 < local_40; local_40 = local_40 + -1) {
      uVar5 = *local_50;
      uVar2 = *_y;
      bVar1 = ""[uVar2 & 0x7f];
      *_x = palette[(ulong)bVar1 + (ulong)(uVar5 >> 7 & 1)];
      _x[1] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 6 & 1)];
      _x[2] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 5 & 1)];
      _x[3] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 4 & 1)];
      _x[4] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 3 & 1)];
      _x[5] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 2 & 1)];
      _x[6] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 1 & 1)];
      _x[7] = palette[(ulong)bVar1 + (ulong)(uVar5 & 1)];
      bVar1 = ""[uVar2 >> 8 & 0x7f];
      _x[8] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0xf & 1)];
      _x[9] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0xe & 1)];
      _x[10] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0xd & 1)];
      _x[0xb] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0xc & 1)];
      _x[0xc] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0xb & 1)];
      _x[0xd] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 10 & 1)];
      _x[0xe] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 9 & 1)];
      _x[0xf] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 8 & 1)];
      bVar1 = ""[uVar2 >> 0x10 & 0x7f];
      _x[0x10] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x17 & 1)];
      _x[0x11] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x16 & 1)];
      _x[0x12] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x15 & 1)];
      _x[0x13] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x14 & 1)];
      _x[0x14] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x13 & 1)];
      _x[0x15] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x12 & 1)];
      _x[0x16] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x11 & 1)];
      _x[0x17] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x10 & 1)];
      bVar1 = ""[uVar2 >> 0x18 & 0x7f];
      _x[0x18] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x1f)];
      _x[0x19] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x1e & 1)];
      _x[0x1a] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x1d & 1)];
      _x[0x1b] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x1c & 1)];
      _x[0x1c] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x1b & 1)];
      _x[0x1d] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x1a & 1)];
      puVar6 = _x + 0x1f;
      _x[0x1e] = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x19 & 1)];
      _x = _x + 0x20;
      *puVar6 = palette[(ulong)bVar1 + (ulong)(uVar5 >> 0x18 & 1)];
      local_50 = local_50 + 1;
      _y = _y + 1;
    }
    _y = _y + (8 - iVar4);
    _x = _x + (iVar4 * -0x20 + 0x100);
    if ((local_44 & 7) != 7) {
      _y = _y + -8;
    }
  }
  return;
}

Assistant:

void zxscreen_convert(const void    *vscr,
                      unsigned int  *poutput,
                      const zxbox_t *dirty)
{
  zxbox_t              box;
  int                  height;
  const unsigned int  *pattrs;
  int                  width;
  int                  x,linear_y;
  const unsigned int  *pinput;
  unsigned int         input;
  unsigned int         attrs;
  const unsigned int  *pal;

  assert(dirty);

#ifdef SHOW_DIRTY_RECTS
  static int dirtybits;
  dirtybits = 0x20202020 - dirtybits;
#endif

  /* Clamp the dirty rectangle to the screen dimensions. */
  box.x0 = CLAMP(dirty->x0, 0, 255);
  box.y0 = CLAMP(dirty->y0, 0, 191);
  box.x1 = CLAMP(dirty->x1, 1, 256);
  box.y1 = CLAMP(dirty->y1, 1, 192);

  /* The inner loop processes 32 pixels at a time, so we need to convert x
   * coordinates into chunks four attributes wide while rounding up and down as
   * required. */
  box.x0 = (box.x0     ) / 32; /* divide to 0..7 rounding down */
  box.x1 = (box.x1 + 31) / 32; /* divide to 0..7 rounding up */

  /* Convert y coordinates into screen space - (0,0) is top left. */
  height = box.y1 - box.y0;
  box.y0 = 192 - box.y1;
  box.y1 = box.y0 + height;

  pattrs = (const unsigned int *) vscr
         + (SCREEN_BITMAP_LENGTH
         + box.y0 / 8 * 32  /* 8 scanlines/row, 32 attrs/row */
         + box.x0 * 4) / 4; /* 4 bytes/chunk, 4 bytes/word */

  poutput += box.y0 * 256 /* 256 pixels/row (256 words) for output */
           + box.x0 * 32; /* 32 pixels/chunk (32 words) */

  width = box.x1 - box.x0; /* hoisted out of loop */

  for (linear_y = box.y0; linear_y < box.y1; linear_y++)
  {
    /* Transpose fields using XOR */
    unsigned int tmp = (linear_y ^ (linear_y >> 3)) & 7;
    int          y   = linear_y ^ (tmp | (tmp << 3));

    pinput = (const unsigned int *) vscr
           + (y     * 32           /* 32 bytes/row */
           + box.x0 * 32 / 8) / 4; /* 32 bytes/row, 8 pixels/byte, 4 bytes/word */
    for (x = width; x > 0; x--) /* x is unused in the loop body */
    {
      input = *pinput++;
      attrs = *pattrs++;
#ifdef SHOW_DIRTY_RECTS
      attrs ^= dirtybits; /* force colour attrs to show redrawn areas */
#endif

      WRITE8PIX(0);
      WRITE8PIX(8);
      WRITE8PIX(16);
      WRITE8PIX(24);
    }

    /* Skip to the start of the next row. */
    pattrs  += 8   - width;
    poutput += 256 - width * 32;

    /* Rewind pattrs except at the end of an attribute row. */
    if ((linear_y & 7) != 7)
      pattrs -= 8;
  }
}